

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O2

void __thiscall LongReadsDatastore::load_index(LongReadsDatastore *this,string *file)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  runtime_error *prVar5;
  SDG_FILETYPE type;
  sdgVersion_t version;
  sdgMagic_t magic;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  uint64_t fPos;
  uint64_t nReads;
  string local_250;
  ifstream input_file;
  byte abStack_210 [488];
  
  std::__cxx11::string::_M_assign((string *)&this->filename);
  iVar1 = open((this->filename)._M_dataplus._M_p,0);
  this->fd = iVar1;
  std::ifstream::ifstream(&input_file,(string *)file,_S_bin);
  if ((abStack_210[*(long *)(_input_file + -0x18)] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
    poVar2 = std::operator<<(poVar2,(string *)file);
    poVar2 = std::operator<<(poVar2,": ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_280,"Could not open ",file);
    std::runtime_error::runtime_error(prVar5,(string *)&local_280);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nReads = 0;
  std::istream::read((char *)&input_file,(long)&magic);
  std::istream::read((char *)&input_file,(long)&version);
  std::istream::read((char *)&input_file,(long)&type);
  if (magic != 0x5d6) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_280,"This file appears to be corrupted: ",file);
    std::runtime_error::runtime_error(prVar5,(string *)&local_280);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (version < 3) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_250,(uint)version);
    std::operator+(&local_280,"Incompatible version",&local_250);
    std::runtime_error::runtime_error(prVar5,(string *)&local_280);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (type == LongDS_FT) {
    std::istream::read((char *)&input_file,(long)&nReads);
    std::istream::read((char *)&input_file,(long)&fPos);
    sdglib::read_string(&input_file,&this->name);
    std::istream::seekg(&input_file,fPos,0);
    sdglib::read_flat_vector<ReadPosSize>(&input_file,&this->read_to_fileRecord);
    poVar2 = sdglib::OutputLog(INFO,true);
    poVar2 = std::operator<<(poVar2,"LongReadsDatastore open: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->filename);
    poVar2 = std::operator<<(poVar2," Total reads: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ifstream::~ifstream(&input_file);
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_250,(uint)type);
  std::operator+(&local_280,"Incompatible file type",&local_250);
  std::runtime_error::runtime_error(prVar5,(string *)&local_280);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LongReadsDatastore::load_index(std::string &file) {
    filename = file;
    fd = open(filename.data(), O_RDONLY);
    std::ifstream input_file(file, std::ios_base::binary);
    if (!input_file) {
        std::cerr << "Failed to open " << file <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + file);
    }
    uint64_t nReads(0);
    uint64_t fPos;

    sdgMagic_t magic;
    sdgVersion_t version;
    SDG_FILETYPE type;
    input_file.read((char *) &magic, sizeof(magic));
    input_file.read((char *) &version, sizeof(version));
    input_file.read((char *) &type, sizeof(type));
    if (magic != SDG_MAGIC) {
        throw std::runtime_error("This file appears to be corrupted: " + file);
    }

    if (version < min_compat) {
        throw std::runtime_error("Incompatible version" + std::to_string(version));
    }

    if (type != LongDS_FT) {
        throw std::runtime_error("Incompatible file type" + std::to_string(type));
    }

    input_file.read((char*)&nReads, sizeof(nReads));

    input_file.read((char*)&fPos, sizeof(fPos));

    sdglib::read_string(input_file, name);

    input_file.seekg(fPos);
    sdglib::read_flat_vector(input_file, read_to_fileRecord);

    sdglib::OutputLog()<<"LongReadsDatastore open: "<<filename<<" Total reads: " <<size()<<std::endl;
}